

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_Call(UA_Server *server,UA_Session *session,UA_CallRequest *request,
                 UA_CallResponse *response)

{
  size_t __nmemb;
  UA_StatusCode UVar1;
  UA_CallMethodResult *pUVar2;
  long lVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  __nmemb = request->methodsToCallSize;
  if (__nmemb == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    pUVar2 = (UA_CallMethodResult *)calloc(__nmemb,0x38);
    response->results = pUVar2;
    if (pUVar2 != (UA_CallMethodResult *)0x0) {
      response->resultsSize = __nmemb;
      lVar4 = 0;
      lVar3 = 0;
      uVar5 = 0;
      do {
        Service_Call_single(server,session,
                            (UA_CallMethodRequest *)
                            ((long)&(request->methodsToCall->objectId).namespaceIndex + lVar4),
                            (UA_CallMethodResult *)((long)&response->results->statusCode + lVar3));
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0x38;
        lVar4 = lVar4 + 0x40;
      } while (uVar5 < request->methodsToCallSize);
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_Call(UA_Server *server, UA_Session *session,
                  const UA_CallRequest *request,
                  UA_CallResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing CallRequest");
    if(request->methodsToCallSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->methodsToCallSize, &UA_TYPES[UA_TYPES_CALLMETHODRESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->methodsToCallSize;

#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
    UA_Boolean isExternal[request->methodsToCallSize];
    UA_UInt32 indices[request->methodsToCallSize];
    memset(isExternal, false, sizeof(UA_Boolean) * request->methodsToCallSize);
    for(size_t j = 0;j<server->externalNamespacesSize;++j) {
        size_t indexSize = 0;
        for(size_t i = 0;i < request->methodsToCallSize;++i) {
            if(request->methodsToCall[i].methodId.namespaceIndex != server->externalNamespaces[j].index)
                continue;
            isExternal[i] = true;
            indices[indexSize] = (UA_UInt32)i;
            ++indexSize;
        }
        if(indexSize == 0)
            continue;
        UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
        ens->call(ens->ensHandle, &request->requestHeader, request->methodsToCall,
                       indices, (UA_UInt32)indexSize, response->results);
    }
#endif
    
    for(size_t i = 0; i < request->methodsToCallSize;++i){
#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
        if(!isExternal[i])
#endif    
            Service_Call_single(server, session, &request->methodsToCall[i], &response->results[i]);
    }
}